

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void gl4cts::EnhancedLayouts::Utils::replaceToken
               (GLchar *token,size_t *search_position,GLchar *text,string *string)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  
  sVar1 = strlen(text);
  pcVar2 = (char *)strlen(token);
  uVar3 = *search_position;
  strlen(token);
  uVar3 = std::__cxx11::string::find((char *)string,(ulong)token,uVar3);
  std::__cxx11::string::replace((ulong)string,uVar3,pcVar2,(ulong)text);
  *search_position = uVar3 + sVar1;
  return;
}

Assistant:

void replaceToken(const GLchar* token, size_t& search_position, const GLchar* text, std::string& string)
{
	const size_t text_length	= strlen(text);
	const size_t token_length   = strlen(token);
	const size_t token_position = string.find(token, search_position);

#if DEBUG_REPLACE_TOKEN
	if (std::string::npos == token_position)
	{
		string.append("\n\nInvalid token: ");
		string.append(token);

		TCU_FAIL(string.c_str());
	}
#endif /* DEBUG_REPLACE_TOKEN */

	string.replace(token_position, token_length, text, text_length);

	search_position = token_position + text_length;
}